

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuCompressedTexture.cpp
# Opt level: O0

IVec3 __thiscall tcu::getBlockPixelSize(tcu *this,CompressedTexFormat format)

{
  bool bVar1;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int extraout_EDX_03;
  int extraout_EDX_04;
  int extraout_EDX_05;
  int extraout_EDX_06;
  int extraout_EDX_07;
  int extraout_EDX_08;
  int extraout_EDX_09;
  int extraout_EDX_10;
  int extraout_EDX_11;
  int extraout_EDX_12;
  int extraout_EDX_13;
  int extraout_EDX_14;
  int extraout_EDX_15;
  int extraout_EDX_16;
  int extraout_EDX_17;
  int extraout_EDX_18;
  int extraout_EDX_19;
  int extraout_EDX_20;
  int extraout_EDX_21;
  int extraout_EDX_22;
  int extraout_EDX_23;
  int extraout_EDX_24;
  int extraout_EDX_25;
  int extraout_EDX_26;
  int extraout_EDX_27;
  int extraout_EDX_28;
  int extraout_EDX_29;
  int iVar2;
  IVec3 IVar3;
  CompressedTexFormat format_local;
  
  bVar1 = isEtcFormat(format);
  if (bVar1) {
    Vector<int,_3>::Vector((Vector<int,_3> *)this,4,4,1);
    iVar2 = extraout_EDX;
  }
  else {
    bVar1 = isAstcFormat(format);
    if (bVar1) {
      switch(format) {
      case COMPRESSEDTEXFORMAT_ASTC_4x4_RGBA:
        Vector<int,_3>::Vector((Vector<int,_3> *)this,4,4,1);
        iVar2 = extraout_EDX_00;
        break;
      case COMPRESSEDTEXFORMAT_ASTC_5x4_RGBA:
        Vector<int,_3>::Vector((Vector<int,_3> *)this,5,4,1);
        iVar2 = extraout_EDX_01;
        break;
      case COMPRESSEDTEXFORMAT_ASTC_5x5_RGBA:
        Vector<int,_3>::Vector((Vector<int,_3> *)this,5,5,1);
        iVar2 = extraout_EDX_02;
        break;
      case COMPRESSEDTEXFORMAT_ASTC_6x5_RGBA:
        Vector<int,_3>::Vector((Vector<int,_3> *)this,6,5,1);
        iVar2 = extraout_EDX_03;
        break;
      case COMPRESSEDTEXFORMAT_ASTC_6x6_RGBA:
        Vector<int,_3>::Vector((Vector<int,_3> *)this,6,6,1);
        iVar2 = extraout_EDX_04;
        break;
      case COMPRESSEDTEXFORMAT_ASTC_8x5_RGBA:
        Vector<int,_3>::Vector((Vector<int,_3> *)this,8,5,1);
        iVar2 = extraout_EDX_05;
        break;
      case COMPRESSEDTEXFORMAT_ASTC_8x6_RGBA:
        Vector<int,_3>::Vector((Vector<int,_3> *)this,8,6,1);
        iVar2 = extraout_EDX_06;
        break;
      case COMPRESSEDTEXFORMAT_ASTC_8x8_RGBA:
        Vector<int,_3>::Vector((Vector<int,_3> *)this,8,8,1);
        iVar2 = extraout_EDX_07;
        break;
      case COMPRESSEDTEXFORMAT_ASTC_10x5_RGBA:
        Vector<int,_3>::Vector((Vector<int,_3> *)this,10,5,1);
        iVar2 = extraout_EDX_08;
        break;
      case COMPRESSEDTEXFORMAT_ASTC_10x6_RGBA:
        Vector<int,_3>::Vector((Vector<int,_3> *)this,10,6,1);
        iVar2 = extraout_EDX_09;
        break;
      case COMPRESSEDTEXFORMAT_ASTC_10x8_RGBA:
        Vector<int,_3>::Vector((Vector<int,_3> *)this,10,8,1);
        iVar2 = extraout_EDX_10;
        break;
      case COMPRESSEDTEXFORMAT_ASTC_10x10_RGBA:
        Vector<int,_3>::Vector((Vector<int,_3> *)this,10,10,1);
        iVar2 = extraout_EDX_11;
        break;
      case COMPRESSEDTEXFORMAT_ASTC_12x10_RGBA:
        Vector<int,_3>::Vector((Vector<int,_3> *)this,0xc,10,1);
        iVar2 = extraout_EDX_12;
        break;
      case COMPRESSEDTEXFORMAT_ASTC_12x12_RGBA:
        Vector<int,_3>::Vector((Vector<int,_3> *)this,0xc,0xc,1);
        iVar2 = extraout_EDX_13;
        break;
      case COMPRESSEDTEXFORMAT_ASTC_4x4_SRGB8_ALPHA8:
        Vector<int,_3>::Vector((Vector<int,_3> *)this,4,4,1);
        iVar2 = extraout_EDX_14;
        break;
      case COMPRESSEDTEXFORMAT_ASTC_5x4_SRGB8_ALPHA8:
        Vector<int,_3>::Vector((Vector<int,_3> *)this,5,4,1);
        iVar2 = extraout_EDX_15;
        break;
      case COMPRESSEDTEXFORMAT_ASTC_5x5_SRGB8_ALPHA8:
        Vector<int,_3>::Vector((Vector<int,_3> *)this,5,5,1);
        iVar2 = extraout_EDX_16;
        break;
      case COMPRESSEDTEXFORMAT_ASTC_6x5_SRGB8_ALPHA8:
        Vector<int,_3>::Vector((Vector<int,_3> *)this,6,5,1);
        iVar2 = extraout_EDX_17;
        break;
      case COMPRESSEDTEXFORMAT_ASTC_6x6_SRGB8_ALPHA8:
        Vector<int,_3>::Vector((Vector<int,_3> *)this,6,6,1);
        iVar2 = extraout_EDX_18;
        break;
      case COMPRESSEDTEXFORMAT_ASTC_8x5_SRGB8_ALPHA8:
        Vector<int,_3>::Vector((Vector<int,_3> *)this,8,5,1);
        iVar2 = extraout_EDX_19;
        break;
      case COMPRESSEDTEXFORMAT_ASTC_8x6_SRGB8_ALPHA8:
        Vector<int,_3>::Vector((Vector<int,_3> *)this,8,6,1);
        iVar2 = extraout_EDX_20;
        break;
      case COMPRESSEDTEXFORMAT_ASTC_8x8_SRGB8_ALPHA8:
        Vector<int,_3>::Vector((Vector<int,_3> *)this,8,8,1);
        iVar2 = extraout_EDX_21;
        break;
      case COMPRESSEDTEXFORMAT_ASTC_10x5_SRGB8_ALPHA8:
        Vector<int,_3>::Vector((Vector<int,_3> *)this,10,5,1);
        iVar2 = extraout_EDX_22;
        break;
      case COMPRESSEDTEXFORMAT_ASTC_10x6_SRGB8_ALPHA8:
        Vector<int,_3>::Vector((Vector<int,_3> *)this,10,6,1);
        iVar2 = extraout_EDX_23;
        break;
      case COMPRESSEDTEXFORMAT_ASTC_10x8_SRGB8_ALPHA8:
        Vector<int,_3>::Vector((Vector<int,_3> *)this,10,8,1);
        iVar2 = extraout_EDX_24;
        break;
      case COMPRESSEDTEXFORMAT_ASTC_10x10_SRGB8_ALPHA8:
        Vector<int,_3>::Vector((Vector<int,_3> *)this,10,10,1);
        iVar2 = extraout_EDX_25;
        break;
      case COMPRESSEDTEXFORMAT_ASTC_12x10_SRGB8_ALPHA8:
        Vector<int,_3>::Vector((Vector<int,_3> *)this,0xc,10,1);
        iVar2 = extraout_EDX_26;
        break;
      case COMPRESSEDTEXFORMAT_ASTC_12x12_SRGB8_ALPHA8:
        Vector<int,_3>::Vector((Vector<int,_3> *)this,0xc,0xc,1);
        iVar2 = extraout_EDX_27;
        break;
      default:
        Vector<int,_3>::Vector((Vector<int,_3> *)this);
        iVar2 = extraout_EDX_28;
      }
    }
    else {
      Vector<int,_3>::Vector((Vector<int,_3> *)this,-1);
      iVar2 = extraout_EDX_29;
    }
  }
  IVar3.m_data[2] = iVar2;
  IVar3.m_data._0_8_ = this;
  return (IVec3)IVar3.m_data;
}

Assistant:

IVec3 getBlockPixelSize (CompressedTexFormat format)
{
	if (isEtcFormat(format))
	{
		return IVec3(4, 4, 1);
	}
	else if (isAstcFormat(format))
	{
		switch (format)
		{
			case COMPRESSEDTEXFORMAT_ASTC_4x4_RGBA:				return IVec3(4,  4,  1);
			case COMPRESSEDTEXFORMAT_ASTC_5x4_RGBA:				return IVec3(5,  4,  1);
			case COMPRESSEDTEXFORMAT_ASTC_5x5_RGBA:				return IVec3(5,  5,  1);
			case COMPRESSEDTEXFORMAT_ASTC_6x5_RGBA:				return IVec3(6,  5,  1);
			case COMPRESSEDTEXFORMAT_ASTC_6x6_RGBA:				return IVec3(6,  6,  1);
			case COMPRESSEDTEXFORMAT_ASTC_8x5_RGBA:				return IVec3(8,  5,  1);
			case COMPRESSEDTEXFORMAT_ASTC_8x6_RGBA:				return IVec3(8,  6,  1);
			case COMPRESSEDTEXFORMAT_ASTC_8x8_RGBA:				return IVec3(8,  8,  1);
			case COMPRESSEDTEXFORMAT_ASTC_10x5_RGBA:			return IVec3(10, 5,  1);
			case COMPRESSEDTEXFORMAT_ASTC_10x6_RGBA:			return IVec3(10, 6,  1);
			case COMPRESSEDTEXFORMAT_ASTC_10x8_RGBA:			return IVec3(10, 8,  1);
			case COMPRESSEDTEXFORMAT_ASTC_10x10_RGBA:			return IVec3(10, 10, 1);
			case COMPRESSEDTEXFORMAT_ASTC_12x10_RGBA:			return IVec3(12, 10, 1);
			case COMPRESSEDTEXFORMAT_ASTC_12x12_RGBA:			return IVec3(12, 12, 1);
			case COMPRESSEDTEXFORMAT_ASTC_4x4_SRGB8_ALPHA8:		return IVec3(4,  4,  1);
			case COMPRESSEDTEXFORMAT_ASTC_5x4_SRGB8_ALPHA8:		return IVec3(5,  4,  1);
			case COMPRESSEDTEXFORMAT_ASTC_5x5_SRGB8_ALPHA8:		return IVec3(5,  5,  1);
			case COMPRESSEDTEXFORMAT_ASTC_6x5_SRGB8_ALPHA8:		return IVec3(6,  5,  1);
			case COMPRESSEDTEXFORMAT_ASTC_6x6_SRGB8_ALPHA8:		return IVec3(6,  6,  1);
			case COMPRESSEDTEXFORMAT_ASTC_8x5_SRGB8_ALPHA8:		return IVec3(8,  5,  1);
			case COMPRESSEDTEXFORMAT_ASTC_8x6_SRGB8_ALPHA8:		return IVec3(8,  6,  1);
			case COMPRESSEDTEXFORMAT_ASTC_8x8_SRGB8_ALPHA8:		return IVec3(8,  8,  1);
			case COMPRESSEDTEXFORMAT_ASTC_10x5_SRGB8_ALPHA8:	return IVec3(10, 5,  1);
			case COMPRESSEDTEXFORMAT_ASTC_10x6_SRGB8_ALPHA8:	return IVec3(10, 6,  1);
			case COMPRESSEDTEXFORMAT_ASTC_10x8_SRGB8_ALPHA8:	return IVec3(10, 8,  1);
			case COMPRESSEDTEXFORMAT_ASTC_10x10_SRGB8_ALPHA8:	return IVec3(10, 10, 1);
			case COMPRESSEDTEXFORMAT_ASTC_12x10_SRGB8_ALPHA8:	return IVec3(12, 10, 1);
			case COMPRESSEDTEXFORMAT_ASTC_12x12_SRGB8_ALPHA8:	return IVec3(12, 12, 1);

			default:
				DE_ASSERT(false);
				return IVec3();
		}
	}
	else
	{
		DE_ASSERT(false);
		return IVec3(-1);
	}
}